

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void duckdb::QuantileOperation::
     WindowInit<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               data_ptr_t g_state)

{
  const_reference pvVar1;
  long lVar2;
  WindowPartitionInput *in_RDX;
  WindowQuantileState<float> *window_state;
  QuantileState<float,_duckdb::QuantileStandardType> *state;
  double ratio;
  double cover;
  double overlap;
  FrameStats *stats;
  unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
  *in_stack_ffffffffffffff98;
  QuantileState<float,_duckdb::QuantileStandardType> *in_stack_ffffffffffffffa0;
  AggregateInputData *in_stack_ffffffffffffffc8;
  
  pvVar1 = std::array<duckdb::FrameDelta,_2UL>::operator[]
                     ((array<duckdb::FrameDelta,_2UL> *)in_stack_ffffffffffffffa0,
                      (size_type)in_stack_ffffffffffffff98);
  lVar2 = *(long *)(pvVar1 + 8);
  pvVar1 = std::array<duckdb::FrameDelta,_2UL>::operator[]
                     ((array<duckdb::FrameDelta,_2UL> *)in_stack_ffffffffffffffa0,
                      (size_type)in_stack_ffffffffffffff98);
  if (lVar2 <= *(long *)pvVar1) {
    pvVar1 = std::array<duckdb::FrameDelta,_2UL>::operator[]
                       ((array<duckdb::FrameDelta,_2UL> *)in_stack_ffffffffffffffa0,
                        (size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 =
         *(unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
           **)pvVar1;
    pvVar1 = std::array<duckdb::FrameDelta,_2UL>::operator[]
                       ((array<duckdb::FrameDelta,_2UL> *)in_stack_ffffffffffffffa0,
                        (size_type)in_stack_ffffffffffffff98);
    lVar2 = (long)in_stack_ffffffffffffff98 - *(long *)(pvVar1 + 8);
    pvVar1 = std::array<duckdb::FrameDelta,_2UL>::operator[]
                       ((array<duckdb::FrameDelta,_2UL> *)in_stack_ffffffffffffffa0,
                        (size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa0 = *(QuantileState<float,_duckdb::QuantileStandardType> **)(pvVar1 + 8)
    ;
    pvVar1 = std::array<duckdb::FrameDelta,_2UL>::operator[]
                       ((array<duckdb::FrameDelta,_2UL> *)in_stack_ffffffffffffffa0,
                        (size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffc8 =
         (AggregateInputData *)
         ((double)lVar2 / (double)((long)in_stack_ffffffffffffffa0 - *(long *)pvVar1));
    if (0.75 < (double)in_stack_ffffffffffffffc8) {
      return;
    }
  }
  QuantileState<float,_duckdb::QuantileStandardType>::GetOrCreateWindowState
            (in_stack_ffffffffffffffa0);
  make_uniq<duckdb::QuantileSortTree,duckdb::AggregateInputData&,duckdb::WindowPartitionInput_const&>
            (in_stack_ffffffffffffffc8,in_RDX);
  unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>::
  operator=((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
             *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
               *)0xa2fd3e);
  return;
}

Assistant:

static void WindowInit(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                       data_ptr_t g_state) {
		D_ASSERT(partition.inputs);

		const auto &stats = partition.stats;

		//	If frames overlap significantly, then use local skip lists.
		if (stats[0].end <= stats[1].begin) {
			//	Frames can overlap
			const auto overlap = double(stats[1].begin - stats[0].end);
			const auto cover = double(stats[1].end - stats[0].begin);
			const auto ratio = overlap / cover;
			if (ratio > .75) {
				return;
			}
		}

		//	Build the tree
		auto &state = *reinterpret_cast<STATE *>(g_state);
		auto &window_state = state.GetOrCreateWindowState();
		window_state.qst = make_uniq<QuantileSortTree>(aggr_input_data, partition);
	}